

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

QVariant * __thiscall
QInputMethodQueryEvent::value
          (QVariant *__return_storage_ptr__,QInputMethodQueryEvent *this,InputMethodQuery query)

{
  QVariant *pQVar1;
  QVariant *pQVar2;
  QVariant *pQVar3;
  long lVar4;
  
  lVar4 = (this->m_values).d.size + 1;
  pQVar3 = &(this->m_values).d.ptr[-1].value;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      return __return_storage_ptr__;
    }
    pQVar1 = (QVariant *)((long)&pQVar3[1].d.data + 8);
    pQVar2 = pQVar3 + 1;
    pQVar3 = pQVar1;
  } while (*(InputMethodQuery *)&(pQVar2->d).data != query);
  ::QVariant::QVariant(__return_storage_ptr__,pQVar1);
  return __return_storage_ptr__;
}

Assistant:

QVariant QInputMethodQueryEvent::value(Qt::InputMethodQuery query) const
{
    for (int i = 0; i < m_values.size(); ++i)
        if (m_values.at(i).query == query)
            return m_values.at(i).value;
    return QVariant();
}